

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeWebAssemblyModuleConstructor
               (DynamicObject *constructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  undefined8 in_RAX;
  uint uVar2;
  JavascriptString *pJVar1;
  ulong uVar3;
  
  uVar2 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,constructor,mode,5,0);
  this = (((constructor->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  uVar3 = (ulong)uVar2 << 0x20;
  (*(constructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(constructor,0xd1,&DAT_1000000000001,2,0,0,uVar3);
  uVar3 = uVar3 & 0xffffffff00000000;
  (*(constructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (constructor,0x124,(this->webAssemblyModulePrototype).ptr,0,0,0,uVar3);
  pJVar1 = CreateStringFromCppLiteral<7ul>(this,(char16 (*) [7])0xffefe8);
  (*(constructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(constructor,0x106,pJVar1,2,0,0,uVar3 & 0xffffffff00000000);
  AddFunctionToLibraryObject
            (this,constructor,0xe8,(FunctionInfo *)WebAssemblyModule::EntryInfo::Exports,1,'\x06');
  AddFunctionToLibraryObject
            (this,constructor,0xe9,(FunctionInfo *)WebAssemblyModule::EntryInfo::Imports,1,'\x06');
  AddFunctionToLibraryObject
            (this,constructor,0xea,(FunctionInfo *)WebAssemblyModule::EntryInfo::CustomSections,2,
             '\x06');
  DynamicObject::SetHasNoEnumerableProperties(constructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeWebAssemblyModuleConstructor(DynamicObject* constructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(constructor, mode, 5);
        JavascriptLibrary* library = constructor->GetLibrary();

        library->AddMember(constructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(constructor, PropertyIds::prototype, library->webAssemblyModulePrototype, PropertyNone);
        library->AddMember(constructor, PropertyIds::name, library->CreateStringFromCppLiteral(_u("Module")), PropertyConfigurable);

        library->AddFunctionToLibraryObject(constructor, PropertyIds::exports, &WebAssemblyModule::EntryInfo::Exports, 1);
        library->AddFunctionToLibraryObject(constructor, PropertyIds::imports, &WebAssemblyModule::EntryInfo::Imports, 1);
        library->AddFunctionToLibraryObject(constructor, PropertyIds::customSections, &WebAssemblyModule::EntryInfo::CustomSections, 2);

        constructor->SetHasNoEnumerableProperties(true);

        return true;
    }